

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_lazy.c
# Opt level: O3

size_t ZSTD_compressBlock_btlazy2_dictMatchState
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  int *ip_00;
  BYTE *iEnd;
  uint uVar1;
  U32 UVar2;
  ZSTD_matchState_t *pZVar3;
  int iVar4;
  seqStore_t *psVar5;
  uint uVar6;
  U32 UVar7;
  size_t sVar8;
  ulong uVar9;
  uint uVar10;
  U32 UVar11;
  BYTE *pBVar12;
  size_t sVar13;
  ulong uVar14;
  int *piVar15;
  BYTE *ip;
  int *piVar16;
  BYTE *pBVar17;
  BYTE *pBVar18;
  seqDef *psVar19;
  int *piVar20;
  U32 UVar21;
  size_t offsetFound;
  size_t local_98;
  uint local_8c;
  int *local_88;
  BYTE *local_80;
  BYTE *local_78;
  U32 local_6c;
  BYTE *local_68;
  BYTE *local_60;
  ZSTD_matchState_t *local_58;
  BYTE *local_50;
  U32 *local_48;
  BYTE *local_40;
  seqStore_t *local_38;
  
  local_78 = (ms->window).base;
  uVar1 = (ms->window).dictLimit;
  local_80 = local_78 + uVar1;
  UVar21 = *rep;
  local_6c = rep[1];
  pZVar3 = ms->dictMatchState;
  local_68 = (pZVar3->window).nextSrc;
  local_60 = (pZVar3->window).base;
  local_40 = local_60 + (pZVar3->window).dictLimit;
  ms->nextToUpdate3 = ms->nextToUpdate;
  iEnd = (BYTE *)((long)src + srcSize);
  local_88 = (int *)((long)src + (srcSize - 8));
  piVar20 = (int *)((ulong)(((int)src - (int)local_80) + (int)local_68 == (int)local_40) + (long)src
                   );
  if (piVar20 < local_88) {
    local_8c = ((int)local_60 - (int)local_68) + uVar1;
    local_50 = local_60 + -(ulong)local_8c;
    local_58 = ms;
    local_48 = rep;
    local_38 = seqStore;
    do {
      uVar6 = (((int)piVar20 - (int)local_78) - UVar21) + 1;
      piVar15 = (int *)(local_78 + uVar6);
      if (uVar6 < uVar1) {
        piVar15 = (int *)(local_60 + (uVar6 - local_8c));
      }
      if ((uVar6 - uVar1 < 0xfffffffd) && (*piVar15 == *(int *)((long)piVar20 + 1))) {
        pBVar12 = iEnd;
        if (uVar6 < uVar1) {
          pBVar12 = local_68;
        }
        sVar8 = ZSTD_count_2segments
                          ((BYTE *)((long)piVar20 + 5),(BYTE *)(piVar15 + 1),iEnd,pBVar12,local_80);
        uVar14 = sVar8 + 4;
      }
      else {
        uVar14 = 0;
      }
      local_98 = 999999999;
      sVar8 = ZSTD_BtFindBestMatch_dictMatchState_selectMLS(local_58,(BYTE *)piVar20,iEnd,&local_98)
      ;
      uVar9 = uVar14;
      if (uVar14 < sVar8) {
        uVar9 = sVar8;
      }
      if (uVar9 < 4) {
        piVar20 = (int *)((long)piVar20 + ((long)piVar20 - (long)src >> 8) + 1);
        UVar2 = local_6c;
      }
      else {
        piVar15 = piVar20;
        sVar13 = local_98;
        if (sVar8 <= uVar14) {
          piVar15 = (int *)((long)piVar20 + 1);
          sVar13 = 0;
        }
        uVar14 = uVar9;
        if (piVar20 < local_88) {
          do {
            ip_00 = (int *)((long)piVar20 + 1);
            uVar6 = ((int)ip_00 - (int)local_78) - UVar21;
            piVar16 = (int *)(local_78 + uVar6);
            if (uVar6 < uVar1) {
              piVar16 = (int *)(local_60 + (uVar6 - local_8c));
            }
            uVar14 = uVar9;
            if ((uVar6 - uVar1 < 0xfffffffd) && (*piVar16 == *ip_00)) {
              pBVar12 = iEnd;
              if (uVar6 < uVar1) {
                pBVar12 = local_68;
              }
              sVar8 = ZSTD_count_2segments
                                ((BYTE *)((long)piVar20 + 5),(BYTE *)(piVar16 + 1),iEnd,pBVar12,
                                 local_80);
              if (sVar8 < 0xfffffffffffffffc) {
                uVar10 = (int)sVar13 + 1;
                uVar6 = 0x1f;
                if (uVar10 != 0) {
                  for (; uVar10 >> uVar6 == 0; uVar6 = uVar6 - 1) {
                  }
                }
                if ((int)((uVar6 ^ 0x1f) + (int)uVar9 * 3 + -0x1e) < (int)(sVar8 + 4) * 3) {
                  sVar13 = 0;
                  uVar14 = sVar8 + 4;
                  piVar15 = ip_00;
                }
              }
            }
            local_98 = 999999999;
            uVar9 = ZSTD_BtFindBestMatch_dictMatchState_selectMLS
                              (local_58,(BYTE *)ip_00,iEnd,&local_98);
            if (uVar9 < 4) {
LAB_00143047:
              if (local_88 <= ip_00) break;
              ip_00 = (int *)((long)piVar20 + 2);
              uVar6 = ((int)ip_00 - (int)local_78) - UVar21;
              piVar16 = (int *)(local_78 + uVar6);
              if (uVar6 < uVar1) {
                piVar16 = (int *)(local_60 + (uVar6 - local_8c));
              }
              if ((uVar6 - uVar1 < 0xfffffffd) && (*piVar16 == *ip_00)) {
                pBVar12 = iEnd;
                if (uVar6 < uVar1) {
                  pBVar12 = local_68;
                }
                sVar8 = ZSTD_count_2segments
                                  ((BYTE *)((long)piVar20 + 6),(BYTE *)(piVar16 + 1),iEnd,pBVar12,
                                   local_80);
                if (sVar8 < 0xfffffffffffffffc) {
                  uVar10 = (int)sVar13 + 1;
                  uVar6 = 0x1f;
                  if (uVar10 != 0) {
                    for (; uVar10 >> uVar6 == 0; uVar6 = uVar6 - 1) {
                    }
                  }
                  if ((int)((uVar6 ^ 0x1f) + (int)uVar14 * 4 + -0x1e) < (int)(sVar8 + 4) * 4) {
                    sVar13 = 0;
                    uVar14 = sVar8 + 4;
                    piVar15 = ip_00;
                  }
                }
              }
              local_98 = 999999999;
              uVar9 = ZSTD_BtFindBestMatch_dictMatchState_selectMLS
                                (local_58,(BYTE *)ip_00,iEnd,&local_98);
              if (uVar9 < 4) break;
              uVar10 = (int)sVar13 + 1;
              uVar6 = 0x1f;
              if (uVar10 != 0) {
                for (; uVar10 >> uVar6 == 0; uVar6 = uVar6 - 1) {
                }
              }
              uVar10 = (int)local_98 + 1;
              iVar4 = 0x1f;
              if (uVar10 != 0) {
                for (; uVar10 >> iVar4 == 0; iVar4 = iVar4 + -1) {
                }
              }
              if ((int)uVar9 * 4 - iVar4 <= (int)((uVar6 ^ 0x1f) + (int)uVar14 * 4 + -0x18)) break;
            }
            else {
              uVar10 = (int)sVar13 + 1;
              uVar6 = 0x1f;
              if (uVar10 != 0) {
                for (; uVar10 >> uVar6 == 0; uVar6 = uVar6 - 1) {
                }
              }
              uVar10 = (int)local_98 + 1;
              iVar4 = 0x1f;
              if (uVar10 != 0) {
                for (; uVar10 >> iVar4 == 0; iVar4 = iVar4 + -1) {
                }
              }
              if ((int)uVar9 * 4 - iVar4 <= (int)((uVar6 ^ 0x1f) + (int)uVar14 * 4 + -0x1b))
              goto LAB_00143047;
            }
            piVar15 = ip_00;
            uVar14 = uVar9;
            sVar13 = local_98;
            piVar20 = piVar15;
          } while (piVar15 < local_88);
        }
        psVar5 = local_38;
        if (sVar13 == 0) {
          UVar11 = 1;
          UVar7 = UVar21;
          UVar2 = local_6c;
        }
        else {
          pBVar17 = (BYTE *)((long)piVar15 + (-(long)local_78 - sVar13) + -0xfffffffe);
          pBVar18 = local_78;
          pBVar12 = local_80;
          if ((uint)pBVar17 < uVar1) {
            pBVar18 = local_50;
            pBVar12 = local_40;
          }
          if ((src < piVar15) && (uVar9 = (ulong)pBVar17 & 0xffffffff, pBVar12 < pBVar18 + uVar9)) {
            pBVar18 = pBVar18 + uVar9;
            do {
              piVar20 = (int *)((long)piVar15 + -1);
              pBVar18 = pBVar18 + -1;
              if ((*(BYTE *)piVar20 != *pBVar18) ||
                 (uVar14 = uVar14 + 1, piVar15 = piVar20, piVar20 <= src)) break;
            } while (pBVar12 < pBVar18);
          }
          UVar11 = (int)sVar13 + 1;
          UVar7 = (int)sVar13 - 2;
          UVar2 = UVar21;
        }
        UVar21 = UVar7;
        uVar9 = (long)piVar15 - (long)src;
        pBVar18 = local_38->lit;
        pBVar12 = pBVar18 + uVar9;
        do {
          *(undefined8 *)pBVar18 = *src;
          pBVar18 = pBVar18 + 8;
          src = (void *)((long)src + 8);
        } while (pBVar18 < pBVar12);
        local_38->lit = local_38->lit + uVar9;
        if (uVar9 < 0x10000) {
          psVar19 = local_38->sequences;
        }
        else {
          local_38->longLengthID = 1;
          psVar19 = local_38->sequences;
          local_38->longLengthPos =
               (U32)((ulong)((long)psVar19 - (long)local_38->sequencesStart) >> 3);
        }
        psVar19->litLength = (U16)uVar9;
        psVar19->offset = UVar11;
        if (0xffff < uVar14 - 3) {
          local_38->longLengthID = 2;
          local_38->longLengthPos =
               (U32)((ulong)((long)psVar19 - (long)local_38->sequencesStart) >> 3);
        }
        psVar19->matchLength = (U16)(uVar14 - 3);
        local_38->sequences = psVar19 + 1;
        piVar20 = (int *)((long)piVar15 + uVar14);
        src = piVar20;
        UVar7 = UVar21;
        if (piVar20 <= local_88) {
          do {
            UVar11 = UVar2;
            uVar6 = ((int)piVar20 - (int)local_78) - UVar11;
            pBVar12 = local_78;
            if (uVar6 < uVar1) {
              pBVar12 = local_50;
            }
            src = piVar20;
            UVar21 = UVar7;
            UVar2 = UVar11;
            if ((0xfffffffc < uVar6 - uVar1) || (*(int *)(pBVar12 + uVar6) != *piVar20)) break;
            pBVar18 = iEnd;
            if (uVar6 < uVar1) {
              pBVar18 = local_68;
            }
            sVar8 = ZSTD_count_2segments
                              ((BYTE *)(piVar20 + 1),(BYTE *)((long)(pBVar12 + uVar6) + 4),iEnd,
                               pBVar18,local_80);
            *(undefined8 *)psVar5->lit = *(undefined8 *)piVar20;
            psVar19 = psVar5->sequences;
            psVar19->litLength = 0;
            psVar19->offset = 1;
            if (0xffff < sVar8 + 1) {
              psVar5->longLengthID = 2;
              psVar5->longLengthPos =
                   (U32)((ulong)((long)psVar19 - (long)psVar5->sequencesStart) >> 3);
            }
            psVar19->matchLength = (U16)(sVar8 + 1);
            psVar5->sequences = psVar19 + 1;
            piVar20 = (int *)((long)piVar20 + sVar8 + 4);
            src = piVar20;
            UVar21 = UVar11;
            UVar2 = UVar7;
            UVar7 = UVar11;
          } while (piVar20 <= local_88);
        }
      }
      local_6c = UVar2;
      rep = local_48;
    } while (piVar20 < local_88);
  }
  *rep = UVar21;
  rep[1] = local_6c;
  return (long)iEnd - (long)src;
}

Assistant:

size_t ZSTD_compressBlock_btlazy2_dictMatchState(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)
{
    return ZSTD_compressBlock_lazy_generic(ms, seqStore, rep, src, srcSize, 1, 2, ZSTD_dictMatchState);
}